

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::MultiTransformNode::MultiTransformNode
          (MultiTransformNode *this,
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          *spaces,Ref<embree::SceneGraph::Node> *child)

{
  long *plVar1;
  long *in_RDX;
  undefined8 *in_RDI;
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  *unaff_retaddr;
  bool in_stack_ffffffffffffffaf;
  Node *in_stack_ffffffffffffffb0;
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  *in_stack_fffffffffffffff8;
  
  Node::Node(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  *in_RDI = &PTR__MultiTransformNode_006090d8;
  std::
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ::vector(unaff_retaddr,in_stack_fffffffffffffff8);
  plVar1 = in_RDI + 0x10;
  *plVar1 = *in_RDX;
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  return;
}

Assistant:

MultiTransformNode(const std::vector<Transformations>& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}